

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
toml::
result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
::
result<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>,std::__cxx11::string>
          (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
           *this,result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
  *prVar1;
  source_ptr *psVar2;
  result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
  rVar3;
  undefined1 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  
  rVar3 = (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
           )other->is_ok_;
  *this = rVar3;
  if (rVar3 == (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
                )0x1) {
    success<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>::
    success<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>>
              ((success<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>> *)
               (this + 8),&(other->field_1).succ.value);
    return;
  }
  prVar1 = this + 0x18;
  *(result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
    **)(this + 8) = prVar1;
  puVar4 = (undefined1 *)(other->field_1).succ.value.first;
  psVar2 = &(other->field_1).succ.value.second.source_;
  if ((source_ptr *)puVar4 == psVar2) {
    p_Var5 = (other->field_1).succ.value.second.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    *(element_type **)prVar1 =
         (psVar2->
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x20) = p_Var5;
  }
  else {
    *(undefined1 **)(this + 8) = puVar4;
    *(element_type **)prVar1 =
         (psVar2->
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
  }
  *(_func_int ***)(this + 0x10) =
       (other->field_1).succ.value.second.super_region_base._vptr_region_base;
  *(source_ptr **)&other->field_1 = psVar2;
  (other->field_1).succ.value.second.super_region_base._vptr_region_base = (_func_int **)0x0;
  *(undefined1 *)((long)&other->field_1 + 0x10) = 0;
  return;
}

Assistant:

bool is_ok()  const noexcept {return is_ok_;}